

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

Test * DyndepParserTestRestatTwice::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x218);
  DyndepParserTestRestatTwice((DyndepParserTestRestatTwice *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(DyndepParserTest, RestatTwice) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build out: dyndep\n"
"  restat = 1\n"
"  restat = 1\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:4: unexpected indent\n", err);
}